

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall GslSpan_FromNullptrCtor_Test::TestBody(GslSpan_FromNullptrCtor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_390;
  Message local_388;
  void *local_380;
  pointer local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_15;
  Message local_358;
  int local_34c;
  index_type local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_14;
  span<const_int_*,__1L> cs_3;
  Message local_318;
  void *local_310;
  pointer local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_13;
  Message local_2e8;
  int local_2dc;
  index_type local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_12;
  span<int_*,__1L> s_3;
  Message local_2a8;
  void *local_2a0;
  pointer local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_11;
  Message local_278;
  int local_26c;
  index_type local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_10;
  span<const_int,__1L> cs_2;
  Message local_238;
  void *local_230;
  pointer local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_9;
  Message local_208;
  int local_1fc;
  index_type local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_8;
  span<int,__1L> s_2;
  Message local_1c8;
  void *local_1c0;
  pointer local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_7;
  Message local_198;
  int local_18c;
  index_type local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_6;
  span<const_int,_0L> cs_1;
  Message local_160;
  void *local_158;
  pointer local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_5;
  Message local_130;
  int local_124;
  index_type local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_4;
  span<int,_0L> s_1;
  Message local_f8;
  void *local_f0;
  pointer local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_3;
  Message local_c8;
  int local_bc;
  index_type local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  span<const_int,__1L> cs;
  Message local_88;
  void *local_80;
  pointer local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58 [3];
  int local_3c;
  index_type local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  span<int,__1L> s;
  GslSpan_FromNullptrCtor_Test *this_local;
  
  pstore::gsl::span<int,_-1L>::span((span<int,__1L> *)&gtest_ar.message_,(nullptr_t)0x0);
  local_38 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&gtest_ar.message_);
  local_3c = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_30,"s.length ()","0",&local_38,&local_3c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_78 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&gtest_ar.message_);
  local_80 = (void *)0x0;
  testing::internal::EqHelper::Compare<int_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_70,"s.data ()","nullptr",&local_78,&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cs.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cs.storage_.data_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cs.storage_.data_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  pstore::gsl::span<const_int,_-1L>::span
            ((span<const_int,__1L> *)&gtest_ar_2.message_,(nullptr_t)0x0);
  local_b8 = pstore::gsl::span<const_int,_-1L>::length((span<const_int,__1L> *)&gtest_ar_2.message_)
  ;
  local_bc = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_b0,"cs.length ()","0",&local_b8,&local_bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_e8 = pstore::gsl::span<const_int,_-1L>::data((span<const_int,__1L> *)&gtest_ar_2.message_);
  local_f0 = (void *)0x0;
  testing::internal::EqHelper::Compare<const_int_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_e0,"cs.data ()","nullptr",&local_e8,&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s_1,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_1);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  pstore::gsl::span<int,_0L>::span((span<int,_0L> *)&gtest_ar_4.message_,(nullptr_t)0x0);
  local_120 = pstore::gsl::span<int,_0L>::length((span<int,_0L> *)&gtest_ar_4.message_);
  local_124 = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_118,"s.length ()","0",&local_120,&local_124);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_150 = pstore::gsl::span<int,_0L>::data((span<int,_0L> *)&gtest_ar_4.message_);
  local_158 = (void *)0x0;
  testing::internal::EqHelper::Compare<int_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_148,"s.data ()","nullptr",&local_150,&local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cs_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cs_1,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cs_1);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  pstore::gsl::span<const_int,_0L>::span((span<const_int,_0L> *)&gtest_ar_6.message_,(nullptr_t)0x0)
  ;
  local_188 = pstore::gsl::span<const_int,_0L>::length((span<const_int,_0L> *)&gtest_ar_6.message_);
  local_18c = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_180,"cs.length ()","0",&local_188,&local_18c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1b8 = pstore::gsl::span<const_int,_0L>::data((span<const_int,_0L> *)&gtest_ar_6.message_);
  local_1c0 = (void *)0x0;
  testing::internal::EqHelper::Compare<const_int_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_1b0,"cs.data ()","nullptr",&local_1b8,&local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s_2.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s_2.storage_.data_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_2.storage_.data_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  pstore::gsl::span<int,_-1L>::span((span<int,__1L> *)&gtest_ar_8.message_,(nullptr_t)0x0);
  local_1f8 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&gtest_ar_8.message_);
  local_1fc = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1f0,"s.length ()","0",&local_1f8,&local_1fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_228 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&gtest_ar_8.message_);
  local_230 = (void *)0x0;
  testing::internal::EqHelper::Compare<int_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_220,"s.data ()","nullptr",&local_228,&local_230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cs_2.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cs_2.storage_.data_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cs_2.storage_.data_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  pstore::gsl::span<const_int,_-1L>::span
            ((span<const_int,__1L> *)&gtest_ar_10.message_,(nullptr_t)0x0);
  local_268 = pstore::gsl::span<const_int,_-1L>::length
                        ((span<const_int,__1L> *)&gtest_ar_10.message_);
  local_26c = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_260,"cs.length ()","0",&local_268,&local_26c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  local_298 = pstore::gsl::span<const_int,_-1L>::data((span<const_int,__1L> *)&gtest_ar_10.message_)
  ;
  local_2a0 = (void *)0x0;
  testing::internal::EqHelper::Compare<const_int_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_290,"cs.data ()","nullptr",&local_298,&local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s_3.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s_3.storage_.data_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_3.storage_.data_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  pstore::gsl::span<int_*,_-1L>::span((span<int_*,__1L> *)&gtest_ar_12.message_,(nullptr_t)0x0);
  local_2d8 = pstore::gsl::span<int_*,_-1L>::length((span<int_*,__1L> *)&gtest_ar_12.message_);
  local_2dc = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_2d0,"s.length ()","0",&local_2d8,&local_2dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_308 = pstore::gsl::span<int_*,_-1L>::data((span<int_*,__1L> *)&gtest_ar_12.message_);
  local_310 = (void *)0x0;
  testing::internal::EqHelper::Compare<int_**,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_300,"s.data ()","nullptr",&local_308,&local_310);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cs_3.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cs_3.storage_.data_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cs_3.storage_.data_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  pstore::gsl::span<const_int_*,_-1L>::span
            ((span<const_int_*,__1L> *)&gtest_ar_14.message_,(nullptr_t)0x0);
  local_348 = pstore::gsl::span<const_int_*,_-1L>::length
                        ((span<const_int_*,__1L> *)&gtest_ar_14.message_);
  local_34c = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_340,"cs.length ()","0",&local_348,&local_34c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  local_378 = pstore::gsl::span<const_int_*,_-1L>::data
                        ((span<const_int_*,__1L> *)&gtest_ar_14.message_);
  local_380 = (void *)0x0;
  testing::internal::EqHelper::Compare<const_int_**,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_370,"cs.data ()","nullptr",&local_378,&local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x8f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_390,&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  return;
}

Assistant:

TEST (GslSpan, FromNullptrCtor) {
    {
        auto s = span<int>{nullptr};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);

        auto cs = span<int const>{nullptr};
        EXPECT_EQ (cs.length (), 0);
        EXPECT_EQ (cs.data (), nullptr);
    }
    {
        auto s = span<int, 0>{nullptr};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);

        auto cs = span<int const, 0>{nullptr};
        EXPECT_EQ (cs.length (), 0);
        EXPECT_EQ (cs.data (), nullptr);
    }

    {
#ifdef CONFIRM_COMPILATION_ERRORS
        span<int, 1> s = nullptr;
        EXPECT_EQ (s.length () == 1 && s.data (), nullptr); // explains why it can't compile
#endif
    }
    {
        span<int> s{nullptr};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);

        span<int const> cs{nullptr};
        EXPECT_EQ (cs.length (), 0);
        EXPECT_EQ (cs.data (), nullptr);
    }
    {
        span<int *> s{nullptr};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);

        span<int const *> cs{nullptr};
        EXPECT_EQ (cs.length (), 0);
        EXPECT_EQ (cs.data (), nullptr);
    }
}